

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

Abc_Obj_t *
Sfm_DecInsert(Abc_Ntk_t *pNtk,Abc_Obj_t *pPivot,int Limit,Vec_Int_t *vGates,Vec_Wec_t *vFanins,
             Vec_Int_t *vMap,Vec_Ptr_t *vGateHandles,int GateBuf,int GateInv,Vec_Wrd_t *vFuncs,
             Vec_Int_t *vTimeNodes,Sfm_Mit_t *pMit)

{
  Vec_Int_t *pVVar1;
  Mio_Gate_t *pGate;
  int *piVar2;
  Abc_Obj_t *pOld;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint iGate;
  uint uVar6;
  Abc_Obj_t *pAVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iFaninNew;
  uint local_64;
  Vec_Int_t *local_60;
  Abc_Ntk_t *local_58;
  long local_50;
  Vec_Wec_t *local_48;
  ulong local_40;
  Abc_Obj_t *local_38;
  
  uVar8 = (ulong)(uint)Limit;
  if (vTimeNodes != (Vec_Int_t *)0x0) {
    vTimeNodes->nSize = 0;
  }
  uVar5 = vGates->nSize;
  local_58 = pNtk;
  if ((int)uVar5 <= Limit) {
    __assert_fail("Limit < Vec_IntSize(vGates)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x6a4,
                  "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                 );
  }
  if (vMap->nSize != Limit) {
    __assert_fail("Limit == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x6a5,
                  "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                 );
  }
  local_40 = uVar8;
  if (Limit + 1U == uVar5) {
    if ((int)uVar5 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
    }
    if (vGates->pArray[(ulong)uVar5 - 1] == GateBuf) {
      if ((-1 < Limit) && (Limit < vFanins->nSize)) {
        if (0 < vFanins->pArray[(uint)Limit].nSize) {
          iVar3 = *vFanins->pArray[(uint)Limit].pArray;
          if ((-1 < (long)iVar3) && (iVar3 < vMap->nSize)) {
            iVar3 = vMap->pArray[iVar3];
            if ((-1 < (long)iVar3) && (iVar3 < pNtk->vObjs->nSize)) {
              pAVar7 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar3];
              if (pMit != (Sfm_Mit_t *)0x0) {
                Sfm_MitTransferLoad(pMit,pAVar7,pPivot);
              }
              Abc_ObjReplace(pPivot,pAVar7);
              *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff;
              Abc_NtkUpdateIncLevel_rec(pAVar7);
              if (vTimeNodes == (Vec_Int_t *)0x0) {
                return pAVar7;
              }
              Vec_IntPush(vTimeNodes,pAVar7->Id);
              return pAVar7;
            }
LAB_004b5377:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
        }
        goto LAB_004b5396;
      }
LAB_004b53b5:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pAVar7 = (Abc_Obj_t *)0x0;
    local_48 = vFanins;
    if ((vTimeNodes != (Vec_Int_t *)0x0) || (vGates->pArray[(ulong)uVar5 - 1] != GateInv))
    goto LAB_004b4f5e;
    local_60 = vGates;
    if ((pPivot->vFanouts).nSize < 1) {
      lVar10 = 0;
    }
    else {
      lVar10 = 0;
      while (pAVar7 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanouts).pArray[lVar10]],
            (*(uint *)&pAVar7->field_0x14 & 0xf) == 7) {
        iVar3 = Mio_GateReadValue((Mio_Gate_t *)(pAVar7->field_5).pData);
        local_50 = CONCAT44(local_50._4_4_,iVar3);
        iVar3 = (pAVar7->vFanins).nSize;
        iVar4 = Abc_NodeFindFanin(pAVar7,pPivot);
        iVar3 = Sfm_LibFindComplInputGate(vFuncs,(int)local_50,iVar3,iVar4,(int *)0x0);
        if ((iVar3 == -1) || (lVar10 = lVar10 + 1, (pPivot->vFanouts).nSize <= lVar10)) break;
      }
    }
    iVar3 = (pPivot->vFanouts).nSize;
    if ((int)lVar10 == iVar3) {
      local_50 = lVar10;
      if (0 < (pPivot->vFanouts).nSize) {
        lVar10 = 0;
        do {
          pAVar7 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanouts).pArray[lVar10]];
          uVar5 = Abc_NodeFindFanin(pAVar7,pPivot);
          local_64 = 0xffffffff;
          iGate = Mio_GateReadValue((Mio_Gate_t *)(pAVar7->field_5).pData);
          uVar6 = Sfm_LibFindComplInputGate
                            (vFuncs,iGate,(pAVar7->vFanins).nSize,uVar5,(int *)&local_64);
          if ((((int)uVar6 < 0) || (uVar6 == iGate)) || ((int)local_64 < 0)) {
            __assert_fail("iGateNew >= 0 && iGateNew != iGate && iFaninNew >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x6c8,
                          "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                         );
          }
          if (vGateHandles->nSize <= (int)uVar6) goto LAB_004b5377;
          pAVar7->field_5 =
               *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)(vGateHandles->pArray + uVar6);
          if (uVar5 != local_64) {
            piVar2 = (pAVar7->vFanins).pArray;
            iVar4 = piVar2[(int)uVar5];
            piVar2[(int)uVar5] = piVar2[local_64];
            piVar2[(int)local_64] = iVar4;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (pPivot->vFanouts).nSize);
      }
      uVar8 = local_40;
      vGates = local_60;
      if (((int)local_40 < 0) || (local_48->nSize <= (int)local_40)) goto LAB_004b53b5;
      if (local_48->pArray[local_40 & 0xffffffff].nSize < 1) {
LAB_004b5396:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = *local_48->pArray[local_40 & 0xffffffff].pArray;
      if (((long)iVar4 < 0) || (vMap->nSize <= iVar4)) goto LAB_004b5396;
      iVar4 = vMap->pArray[iVar4];
      if (((long)iVar4 < 0) || (local_58->vObjs->nSize <= iVar4)) goto LAB_004b5377;
      pAVar7 = (Abc_Obj_t *)local_58->vObjs->pArray[iVar4];
      Abc_ObjReplace(pPivot,pAVar7);
      *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff;
      Abc_NtkUpdateIncLevel_rec(pAVar7);
      lVar10 = local_50;
    }
    else {
      pAVar7 = (Abc_Obj_t *)0x0;
      vGates = local_60;
    }
    if ((int)lVar10 == iVar3) {
      return pAVar7;
    }
  }
  else {
    pAVar7 = (Abc_Obj_t *)0x0;
    local_48 = vFanins;
  }
LAB_004b4f5e:
  uVar5 = (uint)uVar8;
  local_38 = pPivot;
  if ((int)uVar5 < vGates->nSize) {
    uVar9 = uVar8 & 0xffffffff;
    local_60 = vGates;
    do {
      if ((int)uVar8 < 0) goto LAB_004b5396;
      if (local_48->nSize <= (int)uVar9) goto LAB_004b53b5;
      uVar5 = vGates->pArray[uVar9];
      pVVar1 = local_48->pArray;
      pAVar7 = Abc_NtkCreateObj(local_58,ABC_OBJ_NODE);
      if (0 < pVVar1[uVar9].nSize) {
        lVar10 = 0;
        do {
          iVar3 = pVVar1[uVar9].pArray[lVar10];
          if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_004b5396;
          iVar3 = vMap->pArray[iVar3];
          if (((long)iVar3 < 0) || (local_58->vObjs->nSize <= iVar3)) goto LAB_004b5377;
          Abc_ObjAddFanin(pAVar7,(Abc_Obj_t *)local_58->vObjs->pArray[iVar3]);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar1[uVar9].nSize);
      }
      if (((int)uVar5 < 0) || (vGateHandles->nSize <= (int)uVar5)) goto LAB_004b5377;
      pGate = (Mio_Gate_t *)vGateHandles->pArray[uVar5];
      (pAVar7->field_5).pData = pGate;
      iVar3 = (pAVar7->vFanins).nSize;
      iVar4 = Mio_GateReadPinNum(pGate);
      vGates = local_60;
      if (iVar3 != iVar4) {
        __assert_fail("Abc_ObjFaninNum(pObjNew) == Mio_GateReadPinNum((Mio_Gate_t *)pObjNew->pData)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x6e4,
                      "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                     );
      }
      Vec_IntPush(vMap,pAVar7->Id);
      uVar8 = local_40;
      uVar5 = (uint)local_40;
      if (vTimeNodes != (Vec_Int_t *)0x0) {
        Vec_IntPush(vTimeNodes,pAVar7->Id);
      }
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < vGates->nSize);
  }
  pOld = local_38;
  if (pMit != (Sfm_Mit_t *)0x0) {
    Sfm_MitTimingGrow(pMit);
    Sfm_MitTransferLoad(pMit,pAVar7,pOld);
  }
  Abc_ObjReplace(pOld,pAVar7);
  if ((int)uVar5 < vMap->nSize) {
    uVar8 = (ulong)uVar5;
    do {
      if ((int)uVar5 < 0) goto LAB_004b5396;
      iVar3 = vMap->pArray[uVar8];
      if (((long)iVar3 < 0) || (local_58->vObjs->nSize <= iVar3)) goto LAB_004b5377;
      pAVar7 = (Abc_Obj_t *)local_58->vObjs->pArray[iVar3];
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        Abc_NtkUpdateIncLevel_rec(pAVar7);
      }
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < vMap->nSize);
  }
  return pAVar7;
}

Assistant:

Abc_Obj_t * Sfm_DecInsert( Abc_Ntk_t * pNtk, Abc_Obj_t * pPivot, int Limit, Vec_Int_t * vGates, Vec_Wec_t * vFanins, Vec_Int_t * vMap, Vec_Ptr_t * vGateHandles, int GateBuf, int GateInv, Vec_Wrd_t * vFuncs, Vec_Int_t * vTimeNodes, Sfm_Mit_t * pMit )
{
    Abc_Obj_t * pObjNew = NULL; 
    Vec_Int_t * vLevel;
    int i, k, iObj, Gate;
    if ( vTimeNodes )
        Vec_IntClear( vTimeNodes );
    // assuming that new gates are appended at the end
    assert( Limit < Vec_IntSize(vGates) );
    assert( Limit == Vec_IntSize(vMap) );
    if ( Limit + 1 == Vec_IntSize(vGates) )
    {
        Gate = Vec_IntEntryLast(vGates);
        if ( Gate == GateBuf )
        {
            iObj = Vec_WecEntryEntry( vFanins, Limit, 0 );
            pObjNew = Abc_NtkObj( pNtk, Vec_IntEntry(vMap, iObj) );
            // transfer load
            if ( pMit )
                Sfm_MitTransferLoad( pMit, pObjNew, pPivot );
            // replace logic cone
            Abc_ObjReplace( pPivot, pObjNew );
            // update level
            pObjNew->Level = 0;
            Abc_NtkUpdateIncLevel_rec( pObjNew );
            if ( vTimeNodes )
                Vec_IntPush( vTimeNodes, Abc_ObjId(pObjNew) );
            return pObjNew;
        }
        else if ( vTimeNodes == NULL && Gate == GateInv )
        {
            // check if fanouts can be updated
            Abc_Obj_t * pFanout;
            Abc_ObjForEachFanout( pPivot, pFanout, i )
                if ( !Abc_ObjIsNode(pFanout) || Sfm_LibFindComplInputGate(vFuncs, Mio_GateReadValue((Mio_Gate_t*)pFanout->pData), Abc_ObjFaninNum(pFanout), Abc_NodeFindFanin(pFanout, pPivot), NULL) == -1 )
                    break;
            // update fanouts
            if ( i == Abc_ObjFanoutNum(pPivot) )
            {
                Abc_ObjForEachFanout( pPivot, pFanout, i )
                {
                    int iFanin = Abc_NodeFindFanin(pFanout, pPivot), iFaninNew = -1;
                    int iGate = Mio_GateReadValue((Mio_Gate_t*)pFanout->pData);
                    int iGateNew = Sfm_LibFindComplInputGate( vFuncs, iGate, Abc_ObjFaninNum(pFanout), iFanin, &iFaninNew );
                    assert( iGateNew >= 0 && iGateNew != iGate && iFaninNew >= 0 );
                    pFanout->pData = Vec_PtrEntry( vGateHandles, iGateNew );
                    //assert( iFanin == iFaninNew );
                    // swap fanins
                    if ( iFanin != iFaninNew )
                    {
                        int * pArray = Vec_IntArray( &pFanout->vFanins );
                        ABC_SWAP( int, pArray[iFanin], pArray[iFaninNew] );
                    }
                }
                iObj = Vec_WecEntryEntry( vFanins, Limit, 0 );
                pObjNew = Abc_NtkObj( pNtk, Vec_IntEntry(vMap, iObj) );
                Abc_ObjReplace( pPivot, pObjNew );
                // update level
                pObjNew->Level = 0;
                Abc_NtkUpdateIncLevel_rec( pObjNew );
                return pObjNew;
            }
        }
    }
    // introduce new gates
    Vec_IntForEachEntryStart( vGates, Gate, i, Limit )
    {
        vLevel = Vec_WecEntry( vFanins, i );
        pObjNew = Abc_NtkCreateNode( pNtk );
        Vec_IntForEachEntry( vLevel, iObj, k )
            Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, iObj)) );
        pObjNew->pData = Vec_PtrEntry( vGateHandles, Gate );
        assert( Abc_ObjFaninNum(pObjNew) == Mio_GateReadPinNum((Mio_Gate_t *)pObjNew->pData) );
        Vec_IntPush( vMap, Abc_ObjId(pObjNew) );
        if ( vTimeNodes )
            Vec_IntPush( vTimeNodes, Abc_ObjId(pObjNew) );
    }
    // transfer load
    if ( pMit )
    {
        Sfm_MitTimingGrow( pMit );
        Sfm_MitTransferLoad( pMit, pObjNew, pPivot );
    }
    // replace logic cone
    Abc_ObjReplace( pPivot, pObjNew );
    // update level
    Abc_NtkForEachObjVecStart( vMap, pNtk, pObjNew, i, Limit )
        Abc_NtkUpdateIncLevel_rec( pObjNew );
    return pObjNew;
}